

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

int sx_strlen(char *str)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *in_RAX;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  
  uVar6 = (uint)str;
  pcVar5 = str;
  if (((ulong)str & 7) == 0) {
LAB_001097a5:
    do {
      lVar8 = 0;
      do {
        lVar7 = lVar8;
        lVar8 = lVar7 + 8;
      } while ((~(0x101010101010100 - *(ulong *)(pcVar5 + lVar7) | *(ulong *)(pcVar5 + lVar7)) &
               0x8080808080808080) == 0);
      iVar4 = (int)pcVar5;
      if (pcVar5[lVar7] == '\0') {
        iVar4 = (-8 - uVar6) + iVar4;
LAB_00109885:
        in_RAX = (char *)(ulong)(uint)(iVar4 + (int)lVar8);
        bVar2 = false;
      }
      else {
        if (pcVar5[lVar7 + 1] == '\0') {
          iVar4 = (-7 - uVar6) + iVar4;
          goto LAB_00109885;
        }
        if (pcVar5[lVar7 + 2] == '\0') {
          iVar4 = (-6 - uVar6) + iVar4;
          goto LAB_00109885;
        }
        if (pcVar5[lVar7 + 3] == '\0') {
          iVar4 = (-5 - uVar6) + iVar4;
          goto LAB_00109885;
        }
        if (pcVar5[lVar7 + 4] == '\0') {
          iVar4 = (-4 - uVar6) + iVar4;
          goto LAB_00109885;
        }
        if (pcVar5[lVar7 + 5] == '\0') {
          iVar4 = (-3 - uVar6) + iVar4;
          goto LAB_00109885;
        }
        if (pcVar5[lVar7 + 6] == '\0') {
          iVar4 = (-2 - uVar6) + iVar4;
          goto LAB_00109885;
        }
        bVar2 = true;
        if (pcVar5[lVar7 + 7] == '\0') {
          iVar4 = ~uVar6 + iVar4;
          goto LAB_00109885;
        }
      }
      iVar4 = (int)in_RAX;
      pcVar5 = pcVar5 + lVar8;
    } while (bVar2);
  }
  else {
    uVar3 = uVar6;
    if (*str != '\0') {
      pcVar5 = str + 1;
      do {
        in_RAX = str;
        if (((int)str + 1U & 7) == 0) goto LAB_001097a5;
        str = str + 1;
        uVar3 = (uint)str;
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar1 != '\0');
    }
    iVar4 = uVar3 - uVar6;
  }
  return iVar4;
}

Assistant:

int sx_strlen(const char* str)
{
    const char* char_ptr;
    const uintptr_t* longword_ptr;
    uintptr_t longword, himagic, lomagic;

    for (char_ptr = str; ((uintptr_t)char_ptr & (sizeof(longword) - 1)) != 0; ++char_ptr) {
        if (*char_ptr == '\0')
            return (int)(intptr_t)(char_ptr - str);
    }
    longword_ptr = (uintptr_t*)char_ptr;
    himagic = 0x80808080L;
    lomagic = 0x01010101L;
#if SX_ARCH_64BIT
    /* 64-bit version of the magic.  */
    /* Do the shift in two steps to avoid a warning if long has 32 bits.  */
    himagic = ((himagic << 16) << 16) | himagic;
    lomagic = ((lomagic << 16) << 16) | lomagic;
#endif

    for (;;) {
        longword = *longword_ptr++;

        if (((longword - lomagic) & ~longword & himagic) != 0) {
            const char* cp = (const char*)(longword_ptr - 1);

            if (cp[0] == 0)
                return (int)(intptr_t)(cp - str);
            if (cp[1] == 0)
                return (int)(intptr_t)(cp - str + 1);
            if (cp[2] == 0)
                return (int)(intptr_t)(cp - str + 2);
            if (cp[3] == 0)
                return (int)(intptr_t)(cp - str + 3);
#if SX_ARCH_64BIT
            if (cp[4] == 0)
                return (int)(intptr_t)(cp - str + 4);
            if (cp[5] == 0)
                return (int)(intptr_t)(cp - str + 5);
            if (cp[6] == 0)
                return (int)(intptr_t)(cp - str + 6);
            if (cp[7] == 0)
                return (int)(intptr_t)(cp - str + 7);
#endif
        }
    }

    #if !SX_COMPILER_MSVC
    sx_assertf(0, "Not a null-terminated string");
    return -1;
    #endif
}